

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O0

int jpc_ft_synthesize(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  uint parity;
  uint uVar1;
  uint local_4c;
  uint i_1;
  uint maxcols;
  uint i;
  jpc_fix_t *startptr;
  uint colparity;
  uint rowparity;
  uint numcols;
  uint numrows;
  int stride_local;
  int height_local;
  int width_local;
  int ystart_local;
  int xstart_local;
  jpc_fix_t *a_local;
  
  parity = ystart & 1;
  _maxcols = a;
  for (i_1 = 0; i_1 < (uint)height; i_1 = i_1 + 1) {
    jpc_ft_invlift_row(_maxcols,width,xstart & 1U);
    jpc_qmfb_join_row(_maxcols,width,xstart & 1U);
    _maxcols = _maxcols + stride;
  }
  uVar1 = width & 0xfffffff0;
  _maxcols = a;
  for (local_4c = 0; local_4c < uVar1; local_4c = local_4c + 0x10) {
    jpc_ft_invlift_colgrp(_maxcols,height,stride,parity);
    jpc_qmfb_join_colgrp(_maxcols,height,stride,parity);
    _maxcols = _maxcols + 0x10;
  }
  if (uVar1 < (uint)width) {
    jpc_ft_invlift_colres(_maxcols,height,width - uVar1,stride,parity);
    jpc_qmfb_join_colres(_maxcols,height,width - uVar1,stride,parity);
  }
  return 0;
}

Assistant:

int jpc_ft_synthesize(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{
	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;

	jpc_fix_t *startptr;

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_ft_invlift_row(startptr, numcols, colparity);
		jpc_qmfb_join_row(startptr, numcols, colparity);
		startptr += stride;
	}

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_ft_invlift_colgrp(startptr, numrows, stride, rowparity);
		jpc_qmfb_join_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_ft_invlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_qmfb_join_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	return 0;

}